

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

void ggml_add_or_set(ggml_context *ctx,ggml_cgraph *cgraph,size_t isrc,ggml_tensor *tensor)

{
  ggml_tensor *pgVar1;
  ggml_cgraph *in_RCX;
  long in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *src;
  ggml_tensor *tensor_00;
  
  tensor_00 = *(ggml_tensor **)(in_RSI->nb[2] + in_RDX * 8);
  if (tensor_00 == (ggml_tensor *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x1473,"GGML_ASSERT(%s) failed","src");
  }
  if (*(long *)(in_RSI->ne[1] + in_RDX * 8) == 0) {
    *(ggml_cgraph **)(in_RSI->ne[1] + in_RDX * 8) = in_RCX;
  }
  else {
    pgVar1 = ggml_add_impl((ggml_context *)src,in_RDI,in_RSI,SUB81((ulong)in_RDX >> 0x38,0));
    *(ggml_tensor **)(in_RSI->ne[1] + in_RDX * 8) = pgVar1;
  }
  ggml_format_name(*(ggml_tensor **)(in_RSI->ne[1] + in_RDX * 8),"grad for %s",tensor_00->name);
  ggml_build_forward_expand(in_RCX,tensor_00);
  return;
}

Assistant:

static void ggml_add_or_set(
        struct ggml_context * ctx,
        struct ggml_cgraph  * cgraph,
        size_t                isrc,
        struct ggml_tensor  * tensor) {
    struct ggml_tensor * src = cgraph->visited_hash_set.keys[isrc];
    GGML_ASSERT(src);
    if (cgraph->grads[isrc]) {
        cgraph->grads[isrc] = ggml_add_impl(ctx, cgraph->grads[isrc], tensor, /*inplace =*/ cgraph->grad_accs[isrc]);
    } else {
        cgraph->grads[isrc] = tensor;
    }
    ggml_format_name(cgraph->grads[isrc], "grad for %s", src->name);
    ggml_build_forward_expand(cgraph, cgraph->grads[isrc]);
}